

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Cec(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Cec_ParCec_t *p;
  Abc_Cex_t *pAVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  Gia_Man_t *pGVar7;
  FILE *__stream;
  Gia_Man_t *pInit;
  char *pcVar8;
  Abc_Cex_t *t;
  Gia_Man_t *pTemp_1;
  int fDumpMiter;
  int fDualOutput;
  int fMiter;
  int nArgcNew;
  int c;
  char **pArgvNew;
  char *pTemp;
  char *FileName;
  Gia_Man_t *pMiter;
  Gia_Man_t *pSecond;
  FILE *pFile;
  Cec_ParCec_t *pPars;
  uint local_48;
  Cec_ParCec_t ParsCec;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  p = (Cec_ParCec_t *)((long)&pPars + 4);
  bVar2 = false;
  bVar3 = false;
  bVar4 = false;
  ParsCec._28_8_ = argv;
  Cec_ManCecSetDefaultParams(p);
  Extra_UtilGetoptReset();
LAB_002652ac:
  do {
    iVar5 = Extra_UtilGetopt(argc,(char **)ParsCec._28_8_,"CTnmdasvh");
    if (iVar5 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9Cec(): There is no AIG.\n");
        return 1;
      }
      if (bVar2) {
        if (bVar3) {
          uVar6 = Gia_ManPoNum(pAbc->pGia);
          if ((uVar6 & 1) != 0) {
            Abc_Print(-1,"The dual-output miter should have an even number of outputs.\n");
            return 1;
          }
          if (ParsCec.fRewriting == 0) {
            Abc_Print(1,
                      "Assuming the current network is a double-output miter. (Conflict limit = %d.)\n"
                      ,(ulong)pPars._4_4_);
          }
          iVar5 = Cec_ManVerify(pAbc->pGia,p);
          pAbc->Status = iVar5;
        }
        else {
          if (ParsCec.fRewriting == 0) {
            Abc_Print(1,
                      "Assuming the current network is a single-output miter. (Conflict limit = %d.)\n"
                      ,(ulong)pPars._4_4_);
          }
          pGVar7 = Gia_ManDemiterToDual(pAbc->pGia);
          iVar5 = Cec_ManVerify(pGVar7,p);
          pAbc->Status = iVar5;
          pAVar1 = pAbc->pGia->pCexComb;
          pAbc->pGia->pCexComb = pGVar7->pCexComb;
          pGVar7->pCexComb = pAVar1;
          Gia_ManStop(pGVar7);
        }
        Abc_FrameReplaceCex(pAbc,&pAbc->pGia->pCexComb);
        return 0;
      }
      if (argc - globalUtilOptind == 1) {
        pTemp = *(char **)(ParsCec._28_8_ + (long)globalUtilOptind * 8);
      }
      else {
        if (pAbc->pGia->pSpec == (char *)0x0) {
          Abc_Print(-1,"File name is not given on the command line.\n");
          return 1;
        }
        pTemp = pAbc->pGia->pSpec;
      }
      for (pArgvNew = (char **)pTemp; *(char *)pArgvNew != '\0';
          pArgvNew = (char **)((long)pArgvNew + 1)) {
        if (*(char *)pArgvNew == '>') {
          *(undefined1 *)pArgvNew = 0x5c;
        }
      }
      __stream = fopen(pTemp,"r");
      if (__stream == (FILE *)0x0) {
        Abc_Print(-1,"Cannot open input file \"%s\". ",pTemp);
        pcVar8 = Extra_FileGetSimilarName
                           (pTemp,".aig",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
        if (pcVar8 != (char *)0x0) {
          Abc_Print(1,"Did you mean \"%s\"?",pcVar8);
        }
        Abc_Print(1,"\n");
        return 1;
      }
      fclose(__stream);
      pGVar7 = Gia_AigerRead(pTemp,0,0,0);
      if (pGVar7 == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Reading AIGER has failed.\n");
        return 0;
      }
      pInit = Gia_ManMiter(pAbc->pGia,pGVar7,0,1,0,0,ParsCec.fSilent);
      if (pInit != (Gia_Man_t *)0x0) {
        if (bVar4) {
          Abc_Print(0,"The verification miter is written into file \"%s\".\n","cec_miter.aig");
          Gia_AigerWrite(pInit,"cec_miter.aig",0,0);
        }
        iVar5 = Cec_ManVerify(pInit,p);
        pAbc->Status = iVar5;
        Abc_FrameReplaceCex(pAbc,&pAbc->pGia->pCexComb);
        Gia_ManStop(pInit);
      }
      Gia_ManStop(pGVar7);
      return 0;
    }
    switch(iVar5) {
    case 0x43:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
        goto LAB_00265828;
      }
      pPars._4_4_ = atoi(*(char **)(ParsCec._28_8_ + (long)globalUtilOptind * 8));
      uVar6 = pPars._4_4_;
      break;
    default:
      goto LAB_00265828;
    case 0x54:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-T\" should be followed by an integer.\n");
        goto LAB_00265828;
      }
      local_48 = atoi(*(char **)(ParsCec._28_8_ + (long)globalUtilOptind * 8));
      uVar6 = local_48;
      break;
    case 0x61:
      bVar4 = (bool)(bVar4 ^ 1);
      goto LAB_002652ac;
    case 100:
      bVar3 = (bool)(bVar3 ^ 1);
      goto LAB_002652ac;
    case 0x68:
      goto LAB_00265828;
    case 0x6d:
      bVar2 = (bool)(bVar2 ^ 1);
      goto LAB_002652ac;
    case 0x6e:
      ParsCec.fUseSmartCnf = ParsCec.fUseSmartCnf ^ 1;
      goto LAB_002652ac;
    case 0x73:
      ParsCec.fRewriting = ParsCec.fRewriting ^ 1;
      goto LAB_002652ac;
    case 0x76:
      ParsCec.fSilent = ParsCec.fSilent ^ 1;
      goto LAB_002652ac;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)uVar6 < 0) {
LAB_00265828:
      Abc_Print(-2,"usage: &cec [-CT num] [-nmdasvh]\n");
      Abc_Print(-2,"\t         new combinational equivalence checker\n");
      Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
                (ulong)pPars._4_4_);
      Abc_Print(-2,"\t-T num : approximate runtime limit in seconds [default = %d]\n",
                (ulong)local_48);
      pcVar8 = "no";
      if (ParsCec.fUseSmartCnf != 0) {
        pcVar8 = "yes";
      }
      Abc_Print(-2,"\t-n     : toggle using naive SAT-based checking [default = %s]\n",pcVar8);
      pcVar8 = "two circuits";
      if (bVar2) {
        pcVar8 = "miter";
      }
      Abc_Print(-2,"\t-m     : toggle miter vs. two circuits [default = %s]\n",pcVar8);
      pcVar8 = "no";
      if (bVar3) {
        pcVar8 = "yes";
      }
      Abc_Print(-2,"\t-d     : toggle using dual output miter [default = %s]\n",pcVar8);
      pcVar8 = "no";
      if (bVar4) {
        pcVar8 = "yes";
      }
      Abc_Print(-2,"\t-a     : toggle writing dual-output miter [default = %s]\n",pcVar8);
      pcVar8 = "no";
      if (ParsCec.fRewriting != 0) {
        pcVar8 = "yes";
      }
      Abc_Print(-2,"\t-s     : toggle silent operation [default = %s]\n",pcVar8);
      pcVar8 = "no";
      if (ParsCec.fSilent != 0) {
        pcVar8 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar8);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Cec( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Cec_ParCec_t ParsCec, * pPars = &ParsCec;
    FILE * pFile;
    Gia_Man_t * pSecond, * pMiter;
    char * FileName, * pTemp;
    char ** pArgvNew;
    int c, nArgcNew, fMiter = 0, fDualOutput = 0, fDumpMiter = 0;
    Cec_ManCecSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "CTnmdasvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeLimit < 0 )
                goto usage;
            break;
        case 'n':
            pPars->fNaive ^= 1;
            break;
        case 'm':
            fMiter ^= 1;
            break;
        case 'd':
            fDualOutput ^= 1;
            break;
        case 'a':
            fDumpMiter ^= 1;
            break;
        case 's':
            pPars->fSilent ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Cec(): There is no AIG.\n" );
        return 1;
    }
    if ( fMiter )
    {
        if ( fDualOutput )
        {
            if ( Gia_ManPoNum(pAbc->pGia) & 1 )
            {
                Abc_Print( -1, "The dual-output miter should have an even number of outputs.\n" );
                return 1;
            }
            if ( !pPars->fSilent )
            Abc_Print( 1, "Assuming the current network is a double-output miter. (Conflict limit = %d.)\n", pPars->nBTLimit );
            pAbc->Status = Cec_ManVerify( pAbc->pGia, pPars );
        }
        else
        {
            Gia_Man_t * pTemp;
            if ( !pPars->fSilent )
            Abc_Print( 1, "Assuming the current network is a single-output miter. (Conflict limit = %d.)\n", pPars->nBTLimit );
            pTemp = Gia_ManDemiterToDual( pAbc->pGia );
            pAbc->Status = Cec_ManVerify( pTemp, pPars );
            ABC_SWAP( Abc_Cex_t *, pAbc->pGia->pCexComb, pTemp->pCexComb );
            Gia_ManStop( pTemp );
        }        
        Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexComb );
        return 0;
    }

    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        if ( pAbc->pGia->pSpec == NULL )
        {
            Abc_Print( -1, "File name is not given on the command line.\n" );
            return 1;
        }
        FileName = pAbc->pGia->pSpec;
    }
    else
        FileName = pArgvNew[0];
    // fix the wrong symbol
    for ( pTemp = FileName; *pTemp; pTemp++ )
        if ( *pTemp == '>' )
            *pTemp = '\\';
    if ( (pFile = fopen( FileName, "r" )) == NULL )
    {
        Abc_Print( -1, "Cannot open input file \"%s\". ", FileName );
        if ( (FileName = Extra_FileGetSimilarName( FileName, ".aig", NULL, NULL, NULL, NULL )) )
            Abc_Print( 1, "Did you mean \"%s\"?", FileName );
        Abc_Print( 1, "\n" );
        return 1;
    }
    fclose( pFile );
    pSecond = Gia_AigerRead( FileName, 0, 0, 0 );
    if ( pSecond == NULL )
    {
        Abc_Print( -1, "Reading AIGER has failed.\n" );
        return 0;
    }
    // compute the miter
    pMiter = Gia_ManMiter( pAbc->pGia, pSecond, 0, 1, 0, 0, pPars->fVerbose );
    if ( pMiter )
    {
        if ( fDumpMiter )
        {
            Abc_Print( 0, "The verification miter is written into file \"%s\".\n", "cec_miter.aig" );
            Gia_AigerWrite( pMiter, "cec_miter.aig", 0, 0 );
        }
        pAbc->Status = Cec_ManVerify( pMiter, pPars );
        Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexComb );
        Gia_ManStop( pMiter );
    }
    Gia_ManStop( pSecond );
    return 0;

usage:
    Abc_Print( -2, "usage: &cec [-CT num] [-nmdasvh]\n" );
    Abc_Print( -2, "\t         new combinational equivalence checker\n" );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-T num : approximate runtime limit in seconds [default = %d]\n", pPars->TimeLimit );
    Abc_Print( -2, "\t-n     : toggle using naive SAT-based checking [default = %s]\n", pPars->fNaive? "yes":"no");
    Abc_Print( -2, "\t-m     : toggle miter vs. two circuits [default = %s]\n", fMiter? "miter":"two circuits");
    Abc_Print( -2, "\t-d     : toggle using dual output miter [default = %s]\n", fDualOutput? "yes":"no");
    Abc_Print( -2, "\t-a     : toggle writing dual-output miter [default = %s]\n", fDumpMiter? "yes":"no");
    Abc_Print( -2, "\t-s     : toggle silent operation [default = %s]\n", pPars->fSilent ? "yes":"no");
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", pPars->fVerbose? "yes":"no");
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}